

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_func.cpp
# Opt level: O3

void __thiscall FParser::SF_SpawnExplosion(FParser *this)

{
  sector_t_conflict *psVar1;
  bool bVar2;
  PClassActor *type;
  subsector_t *psVar3;
  AActor *this_00;
  FState *newstate;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dd;
  FSoundID local_70;
  FName local_6c;
  undefined1 local_68 [16];
  double local_58;
  svalue_t local_40;
  DVector3 local_28;
  
  if (2 < this->t_argc) {
    svalue_t::svalue_t(&local_40,this->t_argv);
    type = T_GetMobjType(&local_40);
    FString::~FString(&local_40.string);
    if (type != (PClassActor *)0x0) {
      local_28.X = floatvalue(this->t_argv + 1);
      local_68._8_4_ = extraout_XMM0_Dc;
      local_68._0_8_ = local_28.X;
      local_68._12_4_ = extraout_XMM0_Dd;
      local_28.Y = floatvalue(this->t_argv + 2);
      if (this->t_argc < 4) {
        local_58 = local_28.Y;
        psVar3 = P_PointInSubsector((double)local_68._0_8_,local_28.Y);
        psVar1 = psVar3->sector;
        local_28.Z = (local_58 * (psVar1->floorplane).normal.Y +
                     (psVar1->floorplane).D + (double)local_68._0_8_ * (psVar1->floorplane).normal.X
                     ) * (psVar1->floorplane).negiC;
      }
      else {
        local_28.Z = floatvalue(this->t_argv + 3);
      }
      this_00 = AActor::StaticSpawn(type,&local_28,ALLOW_REPLACE,false);
      (this->t_return).type = 1;
      (this->t_return).value.i = 0;
      if (this_00 != (AActor *)0x0) {
        AActor::ClearCounters(this_00);
        local_6c.Index = 0x8c;
        newstate = AActor::FindState(this_00,&local_6c);
        bVar2 = AActor::SetState(this_00,newstate,false);
        *(uint *)&(this->t_return).value = (uint)bVar2;
        local_70.ID = (this_00->DeathSound).super_FSoundID.ID;
        if (local_70.ID != 0) {
          S_Sound(this_00,4,&local_70,1.0,1.0);
        }
      }
    }
    return;
  }
  script_error("Insufficient parameters for \'%s\'\n",(this->t_func).Chars);
  return;
}

Assistant:

void FParser::SF_SpawnExplosion()
{
	DVector3 pos;
	AActor*   spawn;
	PClassActor * pclass;
	
	if (CheckArgs(3))
	{
		if (!(pclass=T_GetMobjType(t_argv[0]))) return;
		
		pos.X = floatvalue(t_argv[1]);
		pos.Y = floatvalue(t_argv[2]);
		if(t_argc > 3)
			pos.Z = floatvalue(t_argv[3]);
		else
			pos.Z = P_PointInSector(pos)->floorplane.ZatPoint(pos);
		
		spawn = Spawn (pclass, pos, ALLOW_REPLACE);
		t_return.type = svt_int;
		t_return.value.i=0;
		if (spawn)
		{
			spawn->ClearCounters();
			t_return.value.i = spawn->SetState(spawn->FindState(NAME_Death));
			if(spawn->DeathSound) S_Sound (spawn, CHAN_BODY, spawn->DeathSound, 1, ATTN_NORM);
		}
	}
}